

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O2

int archeck(int p,double *ar)

{
  double *pdVar1;
  double *pdVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  double *coeff;
  double *ZEROR;
  double *ZEROI;
  void *__ptr;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  undefined4 uVar9;
  ulong uVar10;
  long lVar11;
  
  lVar11 = (long)p;
  coeff = (double *)malloc(lVar11 * 8 + 8);
  ZEROR = (double *)malloc(lVar11 * 8);
  ZEROI = (double *)malloc(lVar11 * 8);
  __ptr = malloc(lVar11 * 4 + 4);
  *coeff = 1.0;
  uVar6 = 0;
  uVar10 = 0;
  if (0 < p) {
    uVar10 = (ulong)(uint)p;
  }
  for (; uVar10 != uVar6; uVar6 = uVar6 + 1) {
    coeff[uVar6 + 1] = -ar[uVar6];
  }
  uVar6 = 0xffffffffffffffff;
  for (uVar7 = 0; (long)uVar7 <= lVar11; uVar7 = uVar7 + 1) {
    uVar4 = uVar6;
    if (coeff[uVar7] != 0.0) {
      uVar4 = uVar7;
    }
    uVar9 = (undefined4)uVar4;
    if (NAN(coeff[uVar7])) {
      uVar9 = (undefined4)uVar7;
    }
    *(undefined4 *)((long)__ptr + uVar7 * 4) = uVar9;
  }
  for (lVar8 = 0; iVar5 = (int)uVar6, lVar8 <= lVar11; lVar8 = lVar8 + 1) {
    uVar3 = *(uint *)((long)__ptr + lVar8 * 4);
    uVar6 = uVar6 & 0xffffffff;
    if (iVar5 <= (int)uVar3) {
      uVar6 = (ulong)uVar3;
    }
  }
  if (iVar5 == 0) {
    free(coeff);
    free(ZEROR);
LAB_0012e793:
    free(ZEROI);
    iVar5 = 1;
  }
  else {
    polyroot(coeff,p,ZEROR,ZEROI);
    uVar6 = 0;
    do {
      if (uVar10 == uVar6) {
        free(coeff);
        free(ZEROR);
        goto LAB_0012e793;
      }
      pdVar2 = ZEROR + uVar6;
      pdVar1 = ZEROI + uVar6;
      uVar6 = uVar6 + 1;
    } while (1.0 <= SQRT(*pdVar1 * *pdVar1 + *pdVar2 * *pdVar2));
    free(coeff);
    free(ZEROR);
    free(ZEROI);
    iVar5 = 0;
  }
  free(__ptr);
  return iVar5;
}

Assistant:

int archeck(int p, double *ar) {
	int check, N, i;
	double *coeff,*zeror,*zeroi,mod,wmaxv;
	int *which,wmax;

	N = p + 1;
	check = 1;

	coeff = (double*)malloc(sizeof(double)*N);
	zeror = (double*)malloc(sizeof(double)*p);
	zeroi = (double*)malloc(sizeof(double)*p);
	which = (int*)malloc(sizeof(int)*N);

	coeff[0] = 1.0;

	for(i = 0; i < p;++i) {
		coeff[i+1] = -ar[i];
	}

	for(i = 0; i < N;++i) {
		if (coeff[i] != 0) {
			which[i] = i;
		} else {
			which[i] = -1;
		}
	}

	wmax = -1;

	for(i = 0; i < N;++i) {
		if (wmax < which[i]) {
			wmax = which[i];
		}
	}

	if (!wmax){
		free(coeff);
		free(zeror);
		free(zeroi);
		free(which);
		return 1;
	}

	//polyroot(double *coeff, int DEGREE, double *ZEROR, double *ZEROI)

	polyroot(coeff,p,zeror,zeroi);

	for(i = 0; i < p;++i) {
		mod = sqrt(pow(zeror[i],2.0) + pow(zeroi[i],2));
		if (mod < 1.0) {
			free(coeff);
			free(zeror);
			free(zeroi);
			free(which);
			return 0;
		}
	}


	free(coeff);
	free(zeror);
	free(zeroi);
	free(which);
	return check;
}